

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

optional<double> slang::strToDouble(string_view str,size_t *pos)

{
  int *piVar1;
  undefined8 extraout_RAX;
  long *in_RDX;
  optional<double> oVar2;
  double val;
  char *end;
  char *start;
  string copy;
  double *__t;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *local_70;
  char *local_68;
  allocator<char> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  _Storage<double,_true> local_10;
  undefined1 local_8;
  
  __t = (double *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  local_68 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x3154ad);
  piVar1 = __errno_location();
  *piVar1 = 0;
  strtod(local_68,&local_70);
  if (local_68 != local_70) {
    piVar1 = __errno_location();
    if (*piVar1 != 0x22) {
      if (in_RDX != (long *)0x0) {
        *in_RDX = (long)local_70 - (long)local_68;
      }
      std::optional<double>::optional<double,_true>
                ((optional<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 __t);
      goto LAB_0031554a;
    }
  }
  std::optional<double>::optional((optional<double> *)&local_10);
LAB_0031554a:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,1));
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)local_8;
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = local_10;
  return (optional<double>)
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double> strToDouble(std::string_view str, size_t* pos) {
    std::string copy(str);
    const char* start = copy.c_str();

    char* end;
    errno = 0;
    double val = strtod(start, &end);

    if (start == end || errno == ERANGE)
        return std::nullopt;

    if (pos)
        *pos = size_t(end - start);
    return val;
}